

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall
Lowerer::LowerScopedStFld
          (Lowerer *this,Instr *stFldInstr,JnHelperMethod helperMethod,bool withInlineCache,
          bool withPropertyOperationFlags,PropertyOperationFlags flags)

{
  LowererMD *this_00;
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  IntConstOpnd *pIVar4;
  Opnd *pOVar5;
  SymOpnd *pSVar6;
  undefined4 *puVar7;
  PropertySymOpnd *pPVar8;
  Lowerer *this_01;
  undefined7 in_register_00000081;
  
  pIVar1 = stFldInstr->m_prev;
  if ((int)CONCAT71(in_register_00000081,withPropertyOperationFlags) != 0) {
    pIVar4 = IR::IntConstOpnd::New((long)(int)flags,TyInt32,this->m_func,true);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,stFldInstr,&pIVar4->super_Opnd);
  }
  if (!withInlineCache) {
    LoadScriptContext(this,stFldInstr);
  }
  pOVar5 = IR::Instr::UnlinkSrc2(stFldInstr);
  this_00 = &this->m_lowererMD;
  LowererMD::LoadHelperArgument(this_00,stFldInstr,pOVar5);
  pOVar5 = IR::Instr::UnlinkSrc1(stFldInstr);
  LowererMD::LoadHelperArgument(this_00,stFldInstr,pOVar5);
  pOVar5 = IR::Instr::UnlinkDst(stFldInstr);
  bVar3 = IR::Opnd::IsSymOpnd(pOVar5);
  if (bVar3) {
    pSVar6 = IR::Opnd::AsSymOpnd(pOVar5);
    if (pSVar6->m_sym->m_kind != SymKindProperty) goto LAB_00547705;
  }
  else {
LAB_00547705:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x20e1,"(dst->IsSymOpnd() && dst->AsSymOpnd()->m_sym->IsPropertySym())",
                       "Expected property sym as dst of field store");
    if (!bVar3) goto LAB_0054785e;
    *puVar7 = 0;
  }
  LoadPropertySymAsArgument(this,stFldInstr,pOVar5);
  if (withInlineCache) {
    pSVar6 = IR::Opnd::AsSymOpnd(pOVar5);
    bVar3 = IR::SymOpnd::IsPropertySymOpnd(pSVar6);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x20e7,"(dst->AsSymOpnd()->IsPropertySymOpnd())",
                         "Need property sym operand to find the inline cache");
      if (!bVar3) {
LAB_0054785e:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    pPVar8 = IR::Opnd::AsPropertySymOpnd(pOVar5);
    pIVar4 = IR::Opnd::CreateInlineCacheIndexOpnd(pPVar8->m_inlineCacheIndex,this->m_func);
    LowererMD::LoadHelperArgument(this_00,stFldInstr,&pIVar4->super_Opnd);
    pPVar8 = IR::Opnd::AsPropertySymOpnd(pOVar5);
    pOVar5 = LoadRuntimeInlineCacheOpnd(this,stFldInstr,pPVar8,false);
    this_01 = (Lowerer *)this_00;
    LowererMD::LoadHelperArgument(this_00,stFldInstr,pOVar5);
    pOVar5 = LoadFunctionBodyOpnd(this_01,stFldInstr);
    LowererMD::LoadHelperArgument(this_00,stFldInstr,pOVar5);
  }
  LowererMD::ChangeToHelperCall
            (this_00,stFldInstr,helperMethod,(LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0,
             false);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerScopedStFld(IR::Instr * stFldInstr, IR::JnHelperMethod helperMethod, bool withInlineCache,
    bool withPropertyOperationFlags, Js::PropertyOperationFlags flags)
{
    IR::Instr *instrPrev = stFldInstr->m_prev;

    if (withPropertyOperationFlags)
    {
        m_lowererMD.LoadHelperArgument(stFldInstr,
            IR::IntConstOpnd::New(static_cast<IntConstType>(flags), IRType::TyInt32, m_func, true));
    }

    if(!withInlineCache)
    {
        LoadScriptContext(stFldInstr);
    }

    // Pass the default instance
    IR::Opnd *src = stFldInstr->UnlinkSrc2();
    m_lowererMD.LoadHelperArgument(stFldInstr, src);

    // Pass the value to store
    src = stFldInstr->UnlinkSrc1();
    m_lowererMD.LoadHelperArgument(stFldInstr, src);

    // Pass the property sym to store to
    IR::Opnd *dst = stFldInstr->UnlinkDst();
    AssertMsg(dst->IsSymOpnd() && dst->AsSymOpnd()->m_sym->IsPropertySym(), "Expected property sym as dst of field store");

    this->LoadPropertySymAsArgument(stFldInstr, dst);

    if (withInlineCache)
    {
        AssertMsg(dst->AsSymOpnd()->IsPropertySymOpnd(), "Need property sym operand to find the inline cache");

        m_lowererMD.LoadHelperArgument(
            stFldInstr,
            IR::Opnd::CreateInlineCacheIndexOpnd(dst->AsPropertySymOpnd()->m_inlineCacheIndex, m_func));

        // Not using the polymorphic inline cache because the fast path only uses the monomorphic inline cache
        this->m_lowererMD.LoadHelperArgument(stFldInstr, this->LoadRuntimeInlineCacheOpnd(stFldInstr, dst->AsPropertySymOpnd()));

        m_lowererMD.LoadHelperArgument(stFldInstr, LoadFunctionBodyOpnd(stFldInstr));
    }

    m_lowererMD.ChangeToHelperCall(stFldInstr, helperMethod);

    return instrPrev;
}